

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O1

void __thiscall dlib::~dlib(dlib *this)

{
  if (this->lib == (void *)0x0) {
    return;
  }
  dlclose();
  return;
}

Assistant:

dlib::~dlib() {
	if (dlib::lib != nullptr) {
#if defined _WIN32
		FreeLibrary(dlib::lib);
#else // _WIN32
		dlclose(dlib::lib);
#endif // _WIN32
	}
}